

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::
HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Callbacks>
::
find<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Entry,capnp::StructSchema&>
          (HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Callbacks>
           *this,ArrayPtr<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_>::Entry>
                 table,StructSchema *params)

{
  AnnotatedHandler *pAVar1;
  bool bVar2;
  uint uVar3;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar4;
  ulong uVar5;
  uint hash;
  Entry *pEVar6;
  int iVar7;
  uint64_t *in_R8;
  Disposer *pDVar8;
  Maybe<unsigned_long> MVar9;
  Type local_40;
  
  pEVar6 = table.ptr;
  pAVar1 = (pEVar6->value).ptr.ptr;
  aVar4.value = table.size_;
  if (pAVar1 != (AnnotatedHandler *)0x0) {
    hash = (uint)((int)(*in_R8 >> 0x20) * 0xbfe3 + (int)*in_R8 != 0);
    uVar3 = kj::_::chooseBucket(hash,(uint)pAVar1);
    uVar5 = (ulong)uVar3;
    pDVar8 = (pEVar6->value).ptr.disposer;
    iVar7 = *(int *)((long)&pDVar8[uVar5]._vptr_Disposer + 4);
    aVar4 = extraout_RDX;
    if (iVar7 != 0) {
      pDVar8 = pDVar8 + uVar5;
      do {
        if ((iVar7 != 1) && (*(uint *)&pDVar8->_vptr_Disposer == hash)) {
          local_40.field_4.scopeId = *in_R8;
          local_40.baseType = STRUCT;
          local_40.listDepth = '\0';
          bVar2 = capnp::Type::operator==
                            ((Type *)((ulong)(iVar7 - 2) * 0x20 + table.size_),&local_40);
          aVar4 = extraout_RDX_00;
          if (bVar2) {
            iVar7 = *(int *)((long)&pDVar8->_vptr_Disposer + 4);
            *this = (HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Callbacks>
                     )0x1;
            *(ulong *)(this + 8) = (ulong)(iVar7 - 2);
            goto LAB_003a5a1d;
          }
        }
        if ((AnnotatedHandler *)(uVar5 + 1) == (pEVar6->value).ptr.ptr) {
          uVar5 = 0;
        }
        else {
          uVar5 = uVar5 + 1 & 0xffffffff;
        }
        pDVar8 = (pEVar6->value).ptr.disposer + uVar5;
        iVar7 = *(int *)((long)&pDVar8->_vptr_Disposer + 4);
      } while (iVar7 != 0);
    }
  }
  *this = (HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Callbacks>
           )0x0;
LAB_003a5a1d:
  MVar9.ptr.field_1.value = aVar4.value;
  MVar9.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar9.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }